

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getUINTPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  Color *pCVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  uint uVar4;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  allocator_type local_69;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  undefined8 local_40;
  ulong local_38;
  
  local_58 = CONCAT44(in_register_0000008c,c3);
  local_68 = CONCAT44(in_register_00000084,c2);
  local_40 = CONCAT44(in_register_00000014,c0);
  local_60 = CONCAT44(in_register_0000000c,c1);
  local_38 = (ulong)(c3 + c2);
  if (c0 + c1 + c3 + c2 != 0x20) {
    __assert_fail("c0 + c1 + c2 + c3 == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x419,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getUINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  if ((((c0 != 0) && (c1 != 0)) && (c2 != 0)) && (c3 != 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((this->super_Image).width * (this->super_Image).height) << 2,&local_69);
    if ((this->super_Image).height != 0) {
      local_44 = -1 << ((byte)local_40 & 0x1f) ^ 0xffffffff;
      if ((uint)local_40 == 0x20) {
        local_44 = 0xffffffff;
      }
      uVar3 = (uint)local_60;
      local_48 = -1 << ((byte)local_60 & 0x1f) ^ 0xffffffff;
      if (uVar3 == 0x20) {
        local_48 = 0xffffffff;
      }
      local_50 = uVar3 + (int)local_38;
      local_4c = -1 << ((byte)local_68 & 0x1f) ^ 0xffffffff;
      if ((uint)local_68 == 0x20) {
        local_4c = 0xffffffff;
      }
      uVar2 = -1 << ((byte)local_58 & 0x1f) ^ 0xffffffff;
      if ((uint)local_58 == 0x20) {
        uVar2 = 0xffffffff;
      }
      uVar4 = 0;
      do {
        uVar5 = (this->super_Image).width;
        if (uVar5 != 0) {
          if (((0x20 < (uint)local_40) || (0x20 < uVar3)) ||
             ((0x20 < (uint)local_68 || (0x20 < (uint)local_58)))) {
            __assert_fail("targetBits > 0 && targetBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                          ,0x109,"uint32_t imageio::convertUINT(uint32_t, uint32_t, uint32_t)");
          }
          uVar7 = 0;
          do {
            pCVar1 = this->pixels;
            uVar6 = (ulong)(uVar5 * uVar4 + uVar7);
            *(uint *)((__return_storage_ptr__->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar6 * 4) =
                 (uint)(long)pCVar1[uVar6].field_0.comps[3] & uVar2 |
                 ((uint)(long)pCVar1[uVar6].field_0.comps[0] & local_44) << ((byte)local_50 & 0x1f)
                 | ((uint)(long)pCVar1[uVar6].field_0.comps[2] & local_4c) <<
                   ((byte)local_58 & 0x1f) |
                   ((uint)(long)pCVar1[uVar6].field_0.comps[1] & local_48) <<
                   ((byte)local_38 & 0x1f);
            uVar7 = uVar7 + 1;
            uVar5 = (this->super_Image).width;
          } while (uVar7 < uVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (this->super_Image).height);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x41a,
                "virtual std::vector<uint8_t> ImageT<float, 4>::getUINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUINTPacked(uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert(c0 + c1 + c2 + c3 == 32);
        assert(c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0);
        assert(componentCount == 4);

        std::vector<uint8_t> data(height * width * sizeof(uint32_t));
        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * sizeof(uint32_t);

                uint32_t pack = 0;
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[0]), sizeof(uint32_t) * 8, c0) << (c1 + c2 + c3);
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[1]), sizeof(uint32_t) * 8, c1) << (c2 + c3);
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[2]), sizeof(uint32_t) * 8, c2) << c3;
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[3]), sizeof(uint32_t) * 8, c3);

                std::memcpy(target, &pack, sizeof(pack));
            }
        }

        return data;
    }